

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  char local_21;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000294810 = 0x2d2d2d2d2d2d2d;
    uRam0000000000294817._0_1_ = '-';
    uRam0000000000294817._1_1_ = '-';
    uRam0000000000294817._2_1_ = '-';
    uRam0000000000294817._3_1_ = '-';
    uRam0000000000294817._4_1_ = '-';
    uRam0000000000294817._5_1_ = '-';
    uRam0000000000294817._6_1_ = '-';
    uRam0000000000294817._7_1_ = '-';
    DAT_00294800 = '-';
    DAT_00294800_1._0_1_ = '-';
    DAT_00294800_1._1_1_ = '-';
    DAT_00294800_1._2_1_ = '-';
    DAT_00294800_1._3_1_ = '-';
    DAT_00294800_1._4_1_ = '-';
    DAT_00294800_1._5_1_ = '-';
    DAT_00294800_1._6_1_ = '-';
    uRam0000000000294808 = 0x2d2d2d2d2d2d2d;
    DAT_0029480f = 0x2d;
    DAT_002947f0 = '-';
    DAT_002947f0_1._0_1_ = '-';
    DAT_002947f0_1._1_1_ = '-';
    DAT_002947f0_1._2_1_ = '-';
    DAT_002947f0_1._3_1_ = '-';
    DAT_002947f0_1._4_1_ = '-';
    DAT_002947f0_1._5_1_ = '-';
    DAT_002947f0_1._6_1_ = '-';
    uRam00000000002947f8._0_1_ = '-';
    uRam00000000002947f8._1_1_ = '-';
    uRam00000000002947f8._2_1_ = '-';
    uRam00000000002947f8._3_1_ = '-';
    uRam00000000002947f8._4_1_ = '-';
    uRam00000000002947f8._5_1_ = '-';
    uRam00000000002947f8._6_1_ = '-';
    uRam00000000002947f8._7_1_ = '-';
    DAT_002947e0 = '-';
    DAT_002947e0_1._0_1_ = '-';
    DAT_002947e0_1._1_1_ = '-';
    DAT_002947e0_1._2_1_ = '-';
    DAT_002947e0_1._3_1_ = '-';
    DAT_002947e0_1._4_1_ = '-';
    DAT_002947e0_1._5_1_ = '-';
    DAT_002947e0_1._6_1_ = '-';
    uRam00000000002947e8._0_1_ = '-';
    uRam00000000002947e8._1_1_ = '-';
    uRam00000000002947e8._2_1_ = '-';
    uRam00000000002947e8._3_1_ = '-';
    uRam00000000002947e8._4_1_ = '-';
    uRam00000000002947e8._5_1_ = '-';
    uRam00000000002947e8._6_1_ = '-';
    uRam00000000002947e8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000002947d8._0_1_ = '-';
    uRam00000000002947d8._1_1_ = '-';
    uRam00000000002947d8._2_1_ = '-';
    uRam00000000002947d8._3_1_ = '-';
    uRam00000000002947d8._4_1_ = '-';
    uRam00000000002947d8._5_1_ = '-';
    uRam00000000002947d8._6_1_ = '-';
    uRam00000000002947d8._7_1_ = '-';
    DAT_0029481f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}